

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyDiscrete.h
# Opt level: O1

Interface_ProblemToPolicyDiscrete * __thiscall
JointPolicyDiscrete::GetInterfacePTPDiscrete(JointPolicyDiscrete *this)

{
  Interface_ProblemToPolicyDiscrete *pIVar1;
  
  if ((this->_m_PTPDshared).px != (element_type *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Calling GetInterfacePTPDiscrete(), should use GetInterfacePTPDiscreteShared() instead"
               ,0x55);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
  }
  pIVar1 = this->_m_PTPD;
  if (pIVar1 == (Interface_ProblemToPolicyDiscrete *)0x0) {
    pIVar1 = (this->_m_PTPDshared).px;
  }
  return pIVar1;
}

Assistant:

const Interface_ProblemToPolicyDiscrete* GetInterfacePTPDiscrete() const
        {
            if(_m_PTPDshared!=0)
                std::cerr << "Calling GetInterfacePTPDiscrete(), should use GetInterfacePTPDiscreteShared() instead"
                          << std::endl;

            if(_m_PTPD)
                return _m_PTPD;
            else
                return _m_PTPDshared.get();
        }